

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

ValueFederate * getValueFed(HelicsFederate fed,HelicsError *err)

{
  element_type *peVar1;
  FedObject *pFVar2;
  ValueFederate *pVVar3;
  
  pFVar2 = helics::getFedObject(fed,err);
  if (pFVar2 != (FedObject *)0x0) {
    if ((((pFVar2->type < INVALID) && ((0x1aU >> (pFVar2->type & 0x1f) & 1) != 0)) &&
        (peVar1 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, peVar1 != (element_type *)0x0)) &&
       (pVVar3 = (ValueFederate *)
                 __dynamic_cast(peVar1,&helics::Federate::typeinfo,&helics::ValueFederate::typeinfo,
                                0xffffffffffffffff), pVVar3 != (ValueFederate *)0x0)) {
      return pVVar3;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -3;
      err->message = "Federate must be a value federate";
    }
  }
  return (ValueFederate *)0x0;
}

Assistant:

helics::ValueFederate* getValueFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::VALUE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto* rval = dynamic_cast<helics::ValueFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notValueFedString);
    return nullptr;
}